

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void RecalculateDrawnSubsectors(void)

{
  long lVar1;
  subsector_t *psVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  psVar2 = subsectors;
  if (0 < numsubsectors) {
    lVar3 = 0;
    iVar4 = numsubsectors;
    do {
      if ((ulong)psVar2[lVar3].numlines != 0) {
        lVar5 = 0;
        do {
          lVar1 = *(long *)((long)&(psVar2[lVar3].firstline)->linedef + lVar5);
          if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x21) & 1) != 0)) {
            *(byte *)&psVar2[lVar3].flags = (byte)psVar2[lVar3].flags | 2;
          }
          lVar5 = lVar5 + 0x48;
          iVar4 = numsubsectors;
        } while ((ulong)psVar2[lVar3].numlines * 0x48 != lVar5);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar4);
  }
  return;
}

Assistant:

void RecalculateDrawnSubsectors()
{
	for(int i=0;i<numsubsectors;i++)
	{
		subsector_t *sub = &subsectors[i];
		for(unsigned int j=0;j<sub->numlines;j++)
		{
			if (sub->firstline[j].linedef != NULL && 
				(sub->firstline[j].linedef->flags & ML_MAPPED))
			{
				sub->flags |= SSECF_DRAWN;
			}
		}
	}
}